

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generalizers.cpp
# Opt level: O2

void am_objgen_cancel_proc(Am_Object *cmd)

{
  Am_Object objgen_window;
  Am_Object local_20;
  Am_Object local_18;
  Am_Object local_10;
  
  Am_Object::Get_Object(&local_10,(Am_Slot_Key)cmd,0x170);
  Am_Object::Get_Owner(&local_18,(Am_Slot_Flags)&local_10);
  Am_Object::~Am_Object(&local_10);
  Am_Object::Am_Object(&local_20,&local_18);
  done_with_objgen_window(&local_20);
  Am_Object::~Am_Object(&local_20);
  Am_Object::~Am_Object(&local_18);
  return;
}

Assistant:

Am_Define_Method(Am_Object_Method, void, am_objgen_cancel, (Am_Object cmd))
{
  Am_Object objgen_window = cmd.Get_Object(Am_SAVED_OLD_OWNER).Get_Owner();
  done_with_objgen_window(objgen_window);
}